

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_close(lua_State *L)

{
  lua_State *L_00;
  StkId pTVar1;
  int iVar2;
  lua_State *L_local;
  
  L_00 = L->l_G->mainthread;
  luaF_close(L_00,L_00->stack);
  luaC_separateudata(L_00,1);
  L_00->errfunc = 0;
  do {
    L_00->ci = L_00->base_ci;
    pTVar1 = L_00->ci->base;
    L_00->top = pTVar1;
    L_00->base = pTVar1;
    L_00->baseCcalls = 0;
    L_00->nCcalls = 0;
    iVar2 = luaD_rawrunprotected(L_00,callallgcTM,(void *)0x0);
  } while (iVar2 != 0);
  close_state(L_00);
  return;
}

Assistant:

static void lua_close(lua_State*L){
L=G(L)->mainthread;
luaF_close(L,L->stack);
luaC_separateudata(L,1);
L->errfunc=0;
do{
L->ci=L->base_ci;
L->base=L->top=L->ci->base;
L->nCcalls=L->baseCcalls=0;
}while(luaD_rawrunprotected(L,callallgcTM,NULL)!=0);
close_state(L);
}